

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O0

void vline_tilde_float(t_vline *x,t_float f)

{
  double *pdVar1;
  float fVar2;
  double dVar3;
  _vseg *p_Var4;
  t_vseg *ptVar5;
  int iVar6;
  t_vseg *ptVar7;
  double dVar8;
  float local_54;
  t_vseg *snew;
  t_vseg *deletefrom;
  t_vseg *s2;
  t_vseg *s1;
  double starttime;
  t_float inlet2;
  t_float inlet1;
  double timenow;
  t_float f_local;
  t_vline *x_local;
  
  dVar8 = clock_gettimesince(x->x_referencetime);
  if (0.0 < x->x_inlet1 || x->x_inlet1 == 0.0) {
    local_54 = x->x_inlet1;
  }
  else {
    local_54 = 0.0;
  }
  fVar2 = x->x_inlet2;
  dVar8 = dVar8 + (double)fVar2;
  iVar6 = PD_BIGORSMALL(f);
  timenow._4_4_ = f;
  if (iVar6 != 0) {
    timenow._4_4_ = 0.0;
  }
  if (fVar2 < 0.0) {
    x->x_value = (double)timenow._4_4_;
    vline_tilde_stop(x);
    return;
  }
  ptVar7 = (t_vseg *)getbytes(0x20);
  if ((x->x_list != (t_vseg *)0x0) && (x->x_list->s_starttime <= dVar8)) {
    dVar3 = x->x_list->s_starttime;
    if (((dVar3 != dVar8) || (NAN(dVar3) || NAN(dVar8))) ||
       ((dVar3 = x->x_list->s_targettime, pdVar1 = &x->x_list->s_starttime,
        dVar3 < *pdVar1 || dVar3 == *pdVar1 && (0.0 < local_54)))) {
      ptVar5 = x->x_list;
      do {
        s2 = ptVar5;
        snew = s2->s_next;
        if (snew == (t_vseg *)0x0) {
          s2->s_next = ptVar7;
          snew = (t_vseg *)0x0;
          goto LAB_0011d212;
        }
        if (dVar8 < snew->s_starttime) break;
        ptVar5 = snew;
      } while (((snew->s_starttime != dVar8) ||
               (ptVar5 = snew, NAN(snew->s_starttime) || NAN(dVar8))) ||
              ((snew->s_targettime < snew->s_starttime || snew->s_targettime == snew->s_starttime &&
               (ptVar5 = snew, 0.0 < local_54))));
      s2->s_next = ptVar7;
      goto LAB_0011d212;
    }
  }
  snew = x->x_list;
  x->x_list = ptVar7;
LAB_0011d212:
  while (snew != (t_vseg *)0x0) {
    p_Var4 = snew->s_next;
    freebytes(snew,0x20);
    snew = p_Var4;
  }
  ptVar7->s_next = (_vseg *)0x0;
  ptVar7->s_target = timenow._4_4_;
  ptVar7->s_starttime = dVar8;
  ptVar7->s_targettime = dVar8 + (double)local_54;
  x->x_inlet2 = 0.0;
  x->x_inlet1 = 0.0;
  return;
}

Assistant:

static void vline_tilde_float(t_vline *x, t_float f)
{
    double timenow = clock_gettimesince(x->x_referencetime);
    t_float inlet1 = (x->x_inlet1 < 0 ? 0 : x->x_inlet1);
    t_float inlet2 = x->x_inlet2;
    double starttime = timenow + inlet2;
    t_vseg *s1, *s2, *deletefrom = 0, *snew;
    if (PD_BIGORSMALL(f))
        f = 0;

        /* negative delay input means stop and jump immediately to new value */
    if (inlet2 < 0)
    {
        x->x_value = f;
        vline_tilde_stop(x);
        return;
    }
    snew = (t_vseg *)t_getbytes(sizeof(*snew));
        /* check if we supplant the first item in the list.  We supplant
        an item by having an earlier starttime, or an equal starttime unless
        the equal one was instantaneous and the new one isn't (in which case
        we'll do a jump-and-slide starting at that time.) */
    if (!x->x_list || x->x_list->s_starttime > starttime ||
        (x->x_list->s_starttime == starttime &&
            (x->x_list->s_targettime > x->x_list->s_starttime || inlet1 <= 0)))
    {
        deletefrom = x->x_list;
        x->x_list = snew;
    }
    else
    {
        for (s1 = x->x_list; (s2 = s1->s_next); s1 = s2)
        {
            if (s2->s_starttime > starttime ||
                (s2->s_starttime == starttime &&
                    (s2->s_targettime > s2->s_starttime || inlet1 <= 0)))
            {
                deletefrom = s2;
                s1->s_next = snew;
                goto didit;
            }
        }
        s1->s_next = snew;
        deletefrom = 0;
    didit: ;
    }
    while (deletefrom)
    {
        s1 = deletefrom->s_next;
        t_freebytes(deletefrom, sizeof(*deletefrom));
        deletefrom = s1;
    }
    snew->s_next = 0;
    snew->s_target = f;
    snew->s_starttime = starttime;
    snew->s_targettime = starttime + inlet1;
    x->x_inlet1 = x->x_inlet2 = 0;
}